

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O3

Var Js::JavascriptWeakSet::EntryDelete(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  EventLog *this;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptWeakSet *pJVar8;
  RecyclableObject *instance;
  RecyclableObject *this_00;
  JavascriptBoolean *pJVar9;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  int in_stack_00000010;
  RecyclableObject *local_60;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  TBValue local_31 [8];
  bool unused;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                ,0x76,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d29188;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_58,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pvVar7 = Arguments::operator[]((Arguments *)local_58,0);
  bVar4 = VarIs<Js::JavascriptWeakSet>(pvVar7);
  if (!bVar4) {
    JavascriptError::ThrowTypeErrorVar(pSVar2,-0x7ff5ec04,L"WeakSet.prototype.delete",L"WeakSet");
  }
  pvVar7 = Arguments::operator[]((Arguments *)local_58,0);
  pJVar8 = VarTo<Js::JavascriptWeakSet>(pvVar7);
  if (((ulong)local_58 & 0xfffffe) == 0) {
    instance = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
  }
  else {
    instance = (RecyclableObject *)Arguments::operator[]((Arguments *)local_58,1);
  }
  BVar5 = JavascriptOperators::IsObject(instance);
  if (BVar5 == 0) {
LAB_00d29099:
    bVar4 = false;
    goto LAB_00d29128;
  }
  if (instance == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00d29188;
    *puVar6 = 0;
LAB_00d29020:
    this_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00d29188;
      *puVar6 = 0;
    }
    TVar1 = ((this_00->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) goto LAB_00d29099;
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this_00);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_00d290ee;
      }
    }
  }
  else if (((ulong)instance & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)instance & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)instance >> 0x32 == 0 && ((ulong)instance & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00d29020;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00d290ee:
    bVar4 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar4) {
LAB_00d29188:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  local_60 = VarTo<Js::RecyclableObject>(instance);
  local_31[0] = false;
  bVar4 = JsUtil::
          SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          ::TryGetValueAndRemove
                    (&(pJVar8->keySet).
                      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     ,&local_60,local_31);
LAB_00d29128:
  if (pSVar2->TTDRecordOrReplayModeEnabled == true) {
    this = ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr)->threadContext->TTDLog;
    if (pSVar2->TTDRecordModeEnabled == true) {
      TTD::EventLog::RecordWeakCollectionContainsEvent(this,bVar4);
    }
    else {
      bVar4 = TTD::EventLog::ReplayWeakCollectionContainsEvent(this);
    }
  }
  pJVar9 = JavascriptLibrary::CreateBoolean
                     ((pSVar2->super_ScriptContextBase).javascriptLibrary,(uint)bVar4);
  return pJVar9;
}

Assistant:

Var JavascriptWeakSet::EntryDelete(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakSet>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakSet.prototype.delete"), _u("WeakSet"));
        }

        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        bool didDelete = false;

        if (JavascriptOperators::IsObject(key) && JavascriptOperators::GetTypeId(key) != TypeIds_HostDispatch)
        {
            RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

            didDelete = weakSet->Delete(keyObj);
        }

#if ENABLE_TTD
        if(scriptContext->IsTTDRecordOrReplayModeEnabled())
        {
            if(scriptContext->IsTTDRecordModeEnabled())
            {
                function->GetScriptContext()->GetThreadContext()->TTDLog->RecordWeakCollectionContainsEvent(didDelete);
            }
            else
            {
                didDelete = function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayWeakCollectionContainsEvent();
            }
        }
#endif

        return scriptContext->GetLibrary()->CreateBoolean(didDelete);
    }